

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_transport_pc.c
# Opt level: O0

int32_t transport_write(uint8_t *buff,uint16_t len)

{
  ssize_t sVar1;
  ssize_t ret;
  uint16_t len_local;
  uint8_t *buff_local;
  
  sVar1 = write(g_tty_fd,buff,(ulong)len);
  return (int32_t)sVar1;
}

Assistant:

int32_t transport_write(uint8_t *buff, uint16_t len)
{
    ssize_t ret = write(g_tty_fd, buff, len);

#ifdef DEBUG_PRINT_EVERY_BYTE_TX_RX
    int i;
    for (i = 0; i < len; i++)
    {
        printf("W: 0x%02x\n", buff[i]);
    }
#endif

    return ret;
}